

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Settings.h
# Opt level: O1

void __thiscall FBX::Settings::Settings(Settings *this,Node *node)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  Vector3 VVar5;
  string local_78;
  int local_58 [2];
  undefined1 local_50 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  double local_30;
  
  paVar1 = &local_78.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"UpAxis","");
  local_58[1] = 2;
  iVar2 = getProperty<int>(node,&local_78,local_58 + 1);
  local_50._0_8_ = &local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"UpAxisSign","");
  local_58[0] = 1;
  iVar3 = getProperty<int>(node,(string *)local_50,local_58);
  VVar5 = parseAxis(iVar2,iVar3);
  this->upAxis = VVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._0_8_ != &local_40) {
    operator_delete((void *)local_50._0_8_,local_40._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"FrontAxis","");
  local_58[1] = 2;
  iVar2 = getProperty<int>(node,&local_78,local_58 + 1);
  local_50._0_8_ = &local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"FrontAxisSign","");
  local_58[0] = 1;
  iVar3 = getProperty<int>(node,(string *)local_50,local_58);
  VVar5 = parseAxis(iVar2,iVar3);
  this->frontAxis = VVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._0_8_ != &local_40) {
    operator_delete((void *)local_50._0_8_,local_40._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"CoordAxis","");
  local_58[1] = 2;
  iVar2 = getProperty<int>(node,&local_78,local_58 + 1);
  local_50._0_8_ = &local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"CoordAxisSign","");
  local_58[0] = 1;
  iVar3 = getProperty<int>(node,(string *)local_50,local_58);
  VVar5 = parseAxis(iVar2,iVar3);
  this->coordAxis = VVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._0_8_ != &local_40) {
    operator_delete((void *)local_50._0_8_,local_40._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"OriginalUpAxis","");
  local_58[1] = 2;
  iVar2 = getProperty<int>(node,&local_78,local_58 + 1);
  local_50._0_8_ = &local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"OriginalUpAxisSign","");
  local_58[0] = 1;
  iVar3 = getProperty<int>(node,(string *)local_50,local_58);
  VVar5 = parseAxis(iVar2,iVar3);
  this->originalUpAxis = VVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._0_8_ != &local_40) {
    operator_delete((void *)local_50._0_8_,local_40._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"UnitScaleFactor","");
  local_50._0_8_ = (pointer)0x3ff0000000000000;
  dVar4 = getProperty<double>(node,&local_78,(double *)local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    local_30 = dVar4;
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    dVar4 = local_30;
  }
  this->unitScaleFactor = dVar4;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"OriginalUnitScaleFactor","");
  local_50._0_8_ = (pointer)0x3ff0000000000000;
  dVar4 = getProperty<double>(node,&local_78,(double *)local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    local_30 = dVar4;
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    dVar4 = local_30;
  }
  this->originalUnitScaleFactor = dVar4;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"AmbientColor","");
  local_50._8_4_ = 0.0;
  local_50._0_8_ = (pointer)0x0;
  VVar5 = getProperty(node,&local_78,(Vector3 *)local_50);
  this->ambientColor = VVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

explicit Settings(const Node &node)
                : upAxis(parseAxis(getProperty<int32_t>(node, "UpAxis", 2),
                                   getProperty<int32_t>(node, "UpAxisSign", 1))),
                  frontAxis(parseAxis(getProperty<int32_t>(node, "FrontAxis", 2),
                                      getProperty<int32_t>(node, "FrontAxisSign", 1))),
                  coordAxis(parseAxis(getProperty<int32_t>(node, "CoordAxis", 2),
                                      getProperty<int32_t>(node, "CoordAxisSign", 1))),
                  originalUpAxis(parseAxis(getProperty<int32_t>(node, "OriginalUpAxis", 2),
                                           getProperty<int32_t>(node, "OriginalUpAxisSign", 1))),
                  unitScaleFactor(getProperty<double>(node, "UnitScaleFactor", 1.0)),
                  originalUnitScaleFactor(getProperty<double>(node, "OriginalUnitScaleFactor", 1.0)),
                  ambientColor(getProperty(node, "AmbientColor", {})) {}